

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::require_texture_query_variant(CompilerHLSL *this,uint32_t var_id)

{
  bool bVar1;
  uint32_t uVar2;
  BaseType BVar3;
  ImageFormat fmt;
  uint uVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  CompilerError *this_00;
  long lVar8;
  TextureSizeVariants *pTVar9;
  bool bVar10;
  ulong uStack_30;
  
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (pSVar5 != (SPIRVariable *)0x0) {
    var_id = (pSVar5->super_IVariant).self.id;
  }
  pSVar6 = Compiler::expression_type((Compiler *)this,var_id);
  uVar2 = (pSVar6->image).sampled;
  bVar10 = uVar2 == 2;
  if ((this->hlsl_options).nonwritable_uav_texture_as_srv == true) {
    bVar10 = Compiler::has_decoration((Compiler *)this,(ID)var_id,DecorationNonWritable);
    bVar10 = (bool)(~bVar10 & uVar2 == 2);
  }
  switch((pSVar6->image).dim) {
  case Dim1D:
    uStack_30 = (ulong)(pSVar6->image).arrayed;
    break;
  case Dim2D:
    bVar1 = (pSVar6->image).arrayed;
    if ((pSVar6->image).ms == true) {
      uStack_30 = (ulong)(bVar1 | 8);
    }
    else {
      uStack_30 = (ulong)(bVar1 | 2);
    }
    break;
  case Dim3D:
    uStack_30 = 4;
    break;
  case Cube:
    uStack_30 = (ulong)((pSVar6->image).arrayed | 6);
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Unsupported query type.");
    goto LAB_00214bf7;
  case Buffer:
    uStack_30 = 5;
  }
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar6->image).type.id);
  BVar3 = pSVar7->basetype;
  if (BVar3 != Float) {
    if (BVar3 == UInt) {
      uStack_30 = (ulong)((uint)uStack_30 | 0x20);
    }
    else {
      if (BVar3 != Int) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unsupported query type.");
LAB_00214bf7:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uStack_30 = (ulong)((uint)uStack_30 | 0x10);
    }
  }
  fmt = (pSVar6->image).format;
  uVar4 = fmt - ImageFormatRgba8;
  if (uVar4 < 0x11) {
    lVar8 = *(long *)(&DAT_00387748 + (ulong)uVar4 * 8);
  }
  else {
    lVar8 = 0;
  }
  if (bVar10 == false) {
    pTVar9 = &this->required_texture_size_variants;
  }
  else {
    uVar4 = image_format_to_components(fmt);
    pTVar9 = (TextureSizeVariants *)
             ((this->required_texture_size_variants).uav[lVar8] + (uVar4 - 1));
  }
  if ((pTVar9->srv >> (uStack_30 & 0x3f) & 1) == 0) {
    Compiler::force_recompile((Compiler *)this);
    pTVar9->srv = pTVar9->srv | 1L << ((byte)uStack_30 & 0x3f);
  }
  return;
}

Assistant:

void CompilerHLSL::require_texture_query_variant(uint32_t var_id)
{
	if (const auto *var = maybe_get_backing_variable(var_id))
		var_id = var->self;

	auto &type = expression_type(var_id);
	bool uav = type.image.sampled == 2;
	if (hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(var_id, DecorationNonWritable))
		uav = false;

	uint32_t bit = 0;
	switch (type.image.dim)
	{
	case Dim1D:
		bit = type.image.arrayed ? Query1DArray : Query1D;
		break;

	case Dim2D:
		if (type.image.ms)
			bit = type.image.arrayed ? Query2DMSArray : Query2DMS;
		else
			bit = type.image.arrayed ? Query2DArray : Query2D;
		break;

	case Dim3D:
		bit = Query3D;
		break;

	case DimCube:
		bit = type.image.arrayed ? QueryCubeArray : QueryCube;
		break;

	case DimBuffer:
		bit = QueryBuffer;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	switch (get<SPIRType>(type.image.type).basetype)
	{
	case SPIRType::Float:
		bit += QueryTypeFloat;
		break;

	case SPIRType::Int:
		bit += QueryTypeInt;
		break;

	case SPIRType::UInt:
		bit += QueryTypeUInt;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	auto norm_state = image_format_to_normalized_state(type.image.format);
	auto &variant = uav ? required_texture_size_variants
	                          .uav[uint32_t(norm_state)][image_format_to_components(type.image.format) - 1] :
	                      required_texture_size_variants.srv;

	uint64_t mask = 1ull << bit;
	if ((variant & mask) == 0)
	{
		force_recompile();
		variant |= mask;
	}
}